

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ark_analytic_partitioned.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  undefined8 uVar2;
  void *flagvalue;
  long in_RSI;
  int in_EDI;
  N_Vector y_err;
  sunrealtype tret;
  SplittingStepCoefficients coefficients;
  void *arkode_mem;
  SUNStepper steppers [2];
  void *nonlinear_mem;
  void *linear_mem;
  N_Vector y_exact;
  N_Vector y;
  int flag;
  SUNContext ctx;
  UserData user_data;
  sunrealtype dt_nonlinear;
  sunrealtype dt_linear;
  sunrealtype dt;
  sunrealtype tf;
  sunrealtype t0;
  char *coefficients_name;
  char *integrator_name;
  long lVar3;
  int opt;
  char *__s1;
  void *in_stack_ffffffffffffff48;
  undefined1 local_b0 [8];
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  UserData *in_stack_ffffffffffffff70;
  sunrealtype in_stack_ffffffffffffff78;
  N_Vector in_stack_ffffffffffffff80;
  undefined8 local_78;
  N_Vector local_70;
  undefined8 local_68;
  undefined4 local_5c;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 local_30;
  undefined8 local_28;
  long local_20;
  char *local_18;
  long local_10;
  int local_8;
  int local_4;
  
  local_4 = 0;
  if (in_EDI < 2) {
    __s1 = "splitting";
  }
  else {
    __s1 = *(char **)(in_RSI + 8);
  }
  local_18 = __s1;
  local_10 = in_RSI;
  local_8 = in_EDI;
  iVar1 = strcmp(__s1,"splitting");
  if ((iVar1 == 0) || (iVar1 = strcmp(local_18,"forcing"), iVar1 == 0)) {
    if (local_8 < 3) {
      lVar3 = 0;
    }
    else {
      lVar3 = *(long *)(local_10 + 0x10);
    }
    local_28 = 0;
    local_30 = 0x3ff0000000000000;
    local_38 = 0x3f847ae147ae147b;
    local_40 = 0x3f60624dd2f1a9fc;
    local_48 = 0x3f50624dd2f1a9fc;
    local_50 = 0x4000000000000000;
    local_20 = lVar3;
    local_5c = SUNContext_Create(0,&local_58);
    opt = (int)((ulong)lVar3 >> 0x20);
    iVar1 = check_flag(in_stack_ffffffffffffff48,__s1,opt);
    if (iVar1 == 0) {
      local_68 = N_VNew_Serial(1,local_58);
      iVar1 = check_flag(in_stack_ffffffffffffff48,__s1,opt);
      if (iVar1 == 0) {
        N_VConst(0x3ff0000000000000,local_68);
        local_70 = exact_sol(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
                             in_stack_ffffffffffffff70);
        printf("\nAnalytical ODE test problem:\n");
        printf("   integrator = %s method\n",local_18);
        if (local_20 != 0) {
          printf("   coefficients = %s\n",local_20);
        }
        printf("   lambda     = %g\n",local_50);
        local_78 = ERKStepCreate(local_28,f_linear,local_68,local_58);
        iVar1 = check_flag(in_stack_ffffffffffffff48,__s1,opt);
        if (iVar1 == 0) {
          local_5c = ARKodeSetUserData(local_78,&local_50);
          iVar1 = check_flag(in_stack_ffffffffffffff48,__s1,opt);
          if (iVar1 == 0) {
            local_5c = ARKodeSetFixedStep(local_40,local_78);
            iVar1 = check_flag(in_stack_ffffffffffffff48,__s1,opt);
            if (iVar1 == 0) {
              uVar2 = ARKStepCreate(local_28,f_nonlinear,0,local_68,local_58);
              iVar1 = check_flag(in_stack_ffffffffffffff48,__s1,opt);
              if (iVar1 == 0) {
                local_5c = ARKodeSetFixedStep(local_48,uVar2);
                iVar1 = check_flag(in_stack_ffffffffffffff48,__s1,opt);
                if (iVar1 == 0) {
                  ARKodeCreateSUNStepper(local_78,&local_98);
                  ARKodeCreateSUNStepper(uVar2,&stack0xffffffffffffff70);
                  iVar1 = strcmp(local_18,"splitting");
                  if (iVar1 == 0) {
                    local_a0 = SplittingStepCreate(local_28,&local_98,2,local_68,local_58);
                    iVar1 = check_flag(in_stack_ffffffffffffff48,__s1,opt);
                    if (iVar1 != 0) {
                      return 1;
                    }
                    if (local_20 != 0) {
                      local_a8 = SplittingStepCoefficients_LoadCoefficientsByName(local_20);
                      iVar1 = check_flag(in_stack_ffffffffffffff48,__s1,opt);
                      if (iVar1 != 0) {
                        return 1;
                      }
                      local_5c = SplittingStepSetCoefficients(local_a0,local_a8);
                      iVar1 = check_flag(in_stack_ffffffffffffff48,__s1,opt);
                      if (iVar1 != 0) {
                        return 1;
                      }
                      SplittingStepCoefficients_Destroy(&local_a8);
                    }
                  }
                  else {
                    local_a0 = ForcingStepCreate(local_28,local_98,in_stack_ffffffffffffff70,
                                                 local_68,local_58);
                    iVar1 = check_flag(in_stack_ffffffffffffff48,__s1,opt);
                    if (iVar1 != 0) {
                      return 1;
                    }
                  }
                  local_5c = ARKodeSetFixedStep(local_38,local_a0);
                  iVar1 = check_flag(in_stack_ffffffffffffff48,__s1,opt);
                  if (iVar1 == 0) {
                    local_5c = ARKodeEvolve(local_30,local_a0,local_68,local_b0,1);
                    iVar1 = check_flag(in_stack_ffffffffffffff48,__s1,opt);
                    if (iVar1 == 0) {
                      flagvalue = (void *)N_VClone(local_68);
                      iVar1 = check_flag(flagvalue,__s1,opt);
                      if (iVar1 == 0) {
                        N_VLinearSum(0x3ff0000000000000,0xbff0000000000000,local_68,local_70,
                                     flagvalue);
                        N_VMaxNorm(flagvalue);
                        printf("\nError: %g\n");
                        printf("\nSplitting Stepper Statistics:\n");
                        local_5c = ARKodePrintAllStats(local_a0,_stdout,0);
                        iVar1 = check_flag(flagvalue,__s1,opt);
                        if (iVar1 == 0) {
                          printf("\nLinear Stepper Statistics:\n");
                          local_5c = ARKodePrintAllStats(local_78,_stdout,0);
                          iVar1 = check_flag(flagvalue,__s1,opt);
                          if (iVar1 == 0) {
                            printf("\nNonlinear Stepper Statistics:\n");
                            local_5c = ARKodePrintAllStats(uVar2,_stdout,0);
                            iVar1 = check_flag(flagvalue,__s1,opt);
                            if (iVar1 == 0) {
                              N_VDestroy(local_68);
                              N_VDestroy(local_70);
                              N_VDestroy(flagvalue);
                              ARKodeFree(&local_78);
                              SUNStepper_Destroy(&local_98);
                              ARKodeFree(&stack0xffffffffffffff80);
                              SUNStepper_Destroy(&stack0xffffffffffffff70);
                              ARKodeFree(&local_a0);
                              SUNContext_Free(&local_58);
                              local_4 = 0;
                            }
                            else {
                              local_4 = 1;
                            }
                          }
                          else {
                            local_4 = 1;
                          }
                        }
                        else {
                          local_4 = 1;
                        }
                      }
                      else {
                        local_4 = 1;
                      }
                    }
                    else {
                      local_4 = 1;
                    }
                  }
                  else {
                    local_4 = 1;
                  }
                }
                else {
                  local_4 = 1;
                }
              }
              else {
                local_4 = 1;
              }
            }
            else {
              local_4 = 1;
            }
          }
          else {
            local_4 = 1;
          }
        }
        else {
          local_4 = 1;
        }
      }
      else {
        local_4 = 1;
      }
    }
    else {
      local_4 = 1;
    }
  }
  else {
    fprintf(_stderr,"Invalid integrator: %s\nMust be \'splitting\' or \'forcing\'\n",local_18);
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int main(int argc, char* argv[])
{
  /* Parse arguments */
  const char* integrator_name = (argc > 1) ? argv[1] : "splitting";
  if (strcmp(integrator_name, "splitting") != 0 &&
      strcmp(integrator_name, "forcing") != 0)
  {
    fprintf(stderr, "Invalid integrator: %s\nMust be 'splitting' or 'forcing'\n",
            integrator_name);
    return 1;
  }
  char* coefficients_name = (argc > 2) ? argv[2] : NULL;

  /* Problem parameters */
  sunrealtype t0           = SUN_RCONST(0.0);  /* initial time */
  sunrealtype tf           = SUN_RCONST(1.0);  /* final time */
  sunrealtype dt           = SUN_RCONST(0.01); /* outer time step */
  sunrealtype dt_linear    = dt / 5;           /* linear integrator time step */
  sunrealtype dt_nonlinear = dt / 10; /* nonlinear integrator time step */

  UserData user_data = {.lambda = SUN_RCONST(2.0)};

  /* Create the SUNDIALS context object for this simulation */
  SUNContext ctx;
  int flag = SUNContext_Create(SUN_COMM_NULL, &ctx);
  if (check_flag(&flag, "SUNContext_Create", 1)) { return 1; }

  /* Initialize vector with initial condition */
  N_Vector y = N_VNew_Serial(1, ctx);
  if (check_flag(y, "N_VNew_Serial", 0)) { return 1; }
  N_VConst(SUN_RCONST(1.0), y);

  N_Vector y_exact = exact_sol(y, tf, &user_data);

  printf("\nAnalytical ODE test problem:\n");
  printf("   integrator = %s method\n", integrator_name);
  if (coefficients_name != NULL)
  {
    printf("   coefficients = %s\n", coefficients_name);
  }
  printf("   lambda     = %" GSYM "\n", user_data.lambda);

  /* Create the integrator for the linear partition */
  void* linear_mem = ERKStepCreate(f_linear, t0, y, ctx);
  if (check_flag(linear_mem, "N_VNew_Serial", 0)) { return 1; }

  flag = ARKodeSetUserData(linear_mem, &user_data);
  if (check_flag(&flag, "ARKodeSetUserData", 1)) { return 1; }

  flag = ARKodeSetFixedStep(linear_mem, dt_linear);
  if (check_flag(&flag, "ARKodeSetFixedStep", 1)) { return 1; }

  /* Create the integrator for the nonlinear partition */
  void* nonlinear_mem = ARKStepCreate(f_nonlinear, NULL, t0, y, ctx);
  if (check_flag(nonlinear_mem, "N_VNew_Serial", 0)) { return 1; }

  flag = ARKodeSetFixedStep(nonlinear_mem, dt_nonlinear);
  if (check_flag(&flag, "ARKodeSetFixedStep", 1)) { return 1; }

  /* Create SUNSteppers out of the integrators */
  SUNStepper steppers[2];
  ARKodeCreateSUNStepper(linear_mem, &steppers[0]);
  ARKodeCreateSUNStepper(nonlinear_mem, &steppers[1]);

  /* Create the outer integrator */
  void* arkode_mem;
  if (strcmp(integrator_name, "splitting") == 0)
  {
    arkode_mem = SplittingStepCreate(steppers, 2, t0, y, ctx);
    if (check_flag(arkode_mem, "SplittingStepCreate", 0)) { return 1; }

    if (coefficients_name != NULL)
    {
      SplittingStepCoefficients coefficients =
        SplittingStepCoefficients_LoadCoefficientsByName(coefficients_name);
      if (check_flag(coefficients,
                     "SplittingStepCoefficients_LoadCoefficientsByName", 0))
      {
        return 1;
      }

      flag = SplittingStepSetCoefficients(arkode_mem, coefficients);
      if (check_flag(&flag, "SplittingStepSetCoefficients", 1)) { return 1; }

      SplittingStepCoefficients_Destroy(&coefficients);
    }
  }
  else
  {
    arkode_mem = ForcingStepCreate(steppers[0], steppers[1], t0, y, ctx);
    if (check_flag(arkode_mem, "ForcingStepCreate", 0)) { return 1; }
  }

  flag = ARKodeSetFixedStep(arkode_mem, dt);
  if (check_flag(&flag, "ARKodeSetFixedStep", 1)) { return 1; }

  /* Compute the numerical solution */
  sunrealtype tret;
  flag = ARKodeEvolve(arkode_mem, tf, y, &tret, ARK_NORMAL);
  if (check_flag(&flag, "ARKodeEvolve", 1)) { return 1; }

  /* Print the numerical error and statistics */
  N_Vector y_err = N_VClone(y);
  if (check_flag(y_err, "N_VClone", 0)) { return 1; }
  N_VLinearSum(SUN_RCONST(1.0), y, -SUN_RCONST(1.0), y_exact, y_err);
  printf("\nError: %" GSYM "\n", N_VMaxNorm(y_err));

  printf("\nSplitting Stepper Statistics:\n");
  flag = ARKodePrintAllStats(arkode_mem, stdout, SUN_OUTPUTFORMAT_TABLE);
  if (check_flag(&flag, "ARKodePrintAllStats", 1)) { return 1; }

  printf("\nLinear Stepper Statistics:\n");
  flag = ARKodePrintAllStats(linear_mem, stdout, SUN_OUTPUTFORMAT_TABLE);
  if (check_flag(&flag, "ARKodePrintAllStats", 1)) { return 1; }

  printf("\nNonlinear Stepper Statistics:\n");
  flag = ARKodePrintAllStats(nonlinear_mem, stdout, SUN_OUTPUTFORMAT_TABLE);
  if (check_flag(&flag, "ARKodePrintAllStats", 1)) { return 1; }

  /* Free memory */
  N_VDestroy(y);
  N_VDestroy(y_exact);
  N_VDestroy(y_err);
  ARKodeFree(&linear_mem);
  SUNStepper_Destroy(&steppers[0]);
  ARKodeFree(&nonlinear_mem);
  SUNStepper_Destroy(&steppers[1]);
  ARKodeFree(&arkode_mem);
  SUNContext_Free(&ctx);

  return 0;
}